

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZETParameterValidation::zetMetricCreateFromProgrammableExpPrologue
          (ZETParameterValidation *this,zet_metric_programmable_exp_handle_t hMetricProgrammable,
          zet_metric_programmable_param_value_exp_t *pParameterValues,uint32_t parameterCount,
          char *pName,char *pDescription,uint32_t *pMetricHandleCount,
          zet_metric_handle_t *phMetricHandles)

{
  ze_result_t zVar1;
  
  if (hMetricProgrammable != (zet_metric_programmable_exp_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if ((pDescription != (char *)0x0 &&
         (pName != (char *)0x0 &&
         pParameterValues != (zet_metric_programmable_param_value_exp_t *)0x0)) &&
       (zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER, pMetricHandleCount != (uint32_t *)0x0)) {
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
}

Assistant:

ze_result_t
    ZETParameterValidation::zetMetricCreateFromProgrammableExpPrologue(
        zet_metric_programmable_exp_handle_t hMetricProgrammable,   ///< [in] handle of the metric programmable
        zet_metric_programmable_param_value_exp_t* pParameterValues,///< [in] list of parameter values to be set.
        uint32_t parameterCount,                        ///< [in] Count of parameters to set.
        const char* pName,                              ///< [in] pointer to metric name to be used. Must point to a
                                                        ///< null-terminated character array no longer than ::ZET_MAX_METRIC_NAME.
        const char* pDescription,                       ///< [in] pointer to metric description to be used. Must point to a
                                                        ///< null-terminated character array no longer than
                                                        ///< ::ZET_MAX_METRIC_DESCRIPTION.
        uint32_t* pMetricHandleCount,                   ///< [in,out] Pointer to the number of metric handles.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< number of metric handles available for this programmable.
                                                        ///< if count is greater than the number of metric handles available, then
                                                        ///< the driver shall update the value with the correct number of metric
                                                        ///< handles available.
        zet_metric_handle_t* phMetricHandles            ///< [in,out][optional][range(0,*pMetricHandleCount)] array of handle of metrics.
                                                        ///< if count is less than the number of metrics available, then driver
                                                        ///< shall only retrieve that number of metric handles.
        )
    {
        if( nullptr == hMetricProgrammable )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == pParameterValues )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pName )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pDescription )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pMetricHandleCount )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ZE_RESULT_SUCCESS;
    }